

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O3

bool __thiscall
cmAddCustomCommandCommand::InitialPass
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  size_t __n;
  pointer pcVar2;
  long *plVar3;
  cmMakefile *this_00;
  bool bVar4;
  pointer pbVar5;
  __type _Var6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  int iVar11;
  const_iterator cVar12;
  cmGlobalGenerator *pcVar13;
  cmSourceFile *pcVar14;
  cmCustomCommand *pcVar15;
  ostream *poVar16;
  PolicyID id;
  MessageType t;
  bool bVar17;
  bool bVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer pbVar20;
  CustomCommandType type;
  __hashtable *__h;
  pointer pbVar21;
  pointer pbVar22;
  string dep;
  string target;
  char *local_370;
  cmCustomCommandLine currentLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  bool local_328;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  ImplicitDependsList implicit_depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  __node_gen_type __node_gen;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [6];
  ios_base local_228 [272];
  string source;
  string depfile;
  string working;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string implicit_depends_lang;
  string comment_buffer;
  string main_dependency;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x80) {
    __node_gen._M_h = (__hashtable_alloc *)local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__node_gen,"called with wrong number of arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__node_gen._M_h != local_288) {
      operator_delete(__node_gen._M_h,local_288[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  source._M_dataplus._M_p = (pointer)&source.field_2;
  source._M_string_length = 0;
  source.field_2._M_local_buf[0] = '\0';
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  main_dependency._M_dataplus._M_p = (pointer)&main_dependency.field_2;
  main_dependency._M_string_length = 0;
  main_dependency.field_2._M_local_buf[0] = '\0';
  working._M_dataplus._M_p = (pointer)&working.field_2;
  working._M_string_length = 0;
  working.field_2._M_local_buf[0] = '\0';
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  depfile.field_2._M_local_buf[0] = '\0';
  comment_buffer._M_dataplus._M_p = (pointer)&comment_buffer.field_2;
  comment_buffer._M_string_length = 0;
  comment_buffer.field_2._M_local_buf[0] = '\0';
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  implicit_depends_lang._M_dataplus._M_p = (pointer)&implicit_depends_lang.field_2;
  implicit_depends_lang._M_string_length = 0;
  implicit_depends_lang.field_2._M_local_buf[0] = '\0';
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  implicit_depends.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyAPPEND_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyAPPEND_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyAPPEND_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyAPPEND_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyAPPEND_abi_cxx11_,"APPEND","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyAPPEND_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyAPPEND_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyARGS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyARGS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyARGS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyARGS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyARGS_abi_cxx11_,"ARGS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyARGS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyARGS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyBYPRODUCTS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyBYPRODUCTS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyBYPRODUCTS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyBYPRODUCTS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyBYPRODUCTS_abi_cxx11_,"BYPRODUCTS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyBYPRODUCTS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyBYPRODUCTS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyCOMMAND_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyCOMMAND_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyCOMMAND_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyCOMMAND_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMAND_abi_cxx11_,"COMMAND","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyCOMMAND_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyCOMMAND_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_,"COMMAND_EXPAND_LISTS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyCOMMENT_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyCOMMENT_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyCOMMENT_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyCOMMENT_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMENT_abi_cxx11_,"COMMENT","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyCOMMENT_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyCOMMENT_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyDEPENDS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyDEPENDS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyDEPENDS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyDEPENDS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyDEPENDS_abi_cxx11_,"DEPENDS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyDEPENDS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyDEPENDS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyDEPFILE_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyDEPFILE_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyDEPFILE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyDEPFILE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyDEPFILE_abi_cxx11_,"DEPFILE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyDEPFILE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyDEPFILE_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyIMPLICIT_DEPENDS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyIMPLICIT_DEPENDS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyIMPLICIT_DEPENDS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyIMPLICIT_DEPENDS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyIMPLICIT_DEPENDS_abi_cxx11_,"IMPLICIT_DEPENDS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyIMPLICIT_DEPENDS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyIMPLICIT_DEPENDS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyMAIN_DEPENDENCY_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyMAIN_DEPENDENCY_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyMAIN_DEPENDENCY_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyMAIN_DEPENDENCY_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyMAIN_DEPENDENCY_abi_cxx11_,"MAIN_DEPENDENCY","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyMAIN_DEPENDENCY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyMAIN_DEPENDENCY_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyOUTPUT_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyOUTPUT_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyOUTPUT_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyOUTPUT_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyOUTPUT_abi_cxx11_,"OUTPUT","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyOUTPUT_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyOUTPUT_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyOUTPUTS_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyOUTPUTS_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyOUTPUTS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyOUTPUTS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyOUTPUTS_abi_cxx11_,"OUTPUTS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyOUTPUTS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyOUTPUTS_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyPOST_BUILD_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyPOST_BUILD_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyPOST_BUILD_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyPOST_BUILD_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPOST_BUILD_abi_cxx11_,"POST_BUILD","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyPOST_BUILD_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPOST_BUILD_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyPRE_BUILD_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyPRE_BUILD_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyPRE_BUILD_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyPRE_BUILD_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPRE_BUILD_abi_cxx11_,"PRE_BUILD","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyPRE_BUILD_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPRE_BUILD_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyPRE_LINK_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyPRE_LINK_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyPRE_LINK_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyPRE_LINK_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPRE_LINK_abi_cxx11_,"PRE_LINK","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyPRE_LINK_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPRE_LINK_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keySOURCE_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keySOURCE_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keySOURCE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keySOURCE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keySOURCE_abi_cxx11_,"SOURCE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keySOURCE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keySOURCE_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyTARGET_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyTARGET_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyTARGET_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyTARGET_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyTARGET_abi_cxx11_,"TARGET","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyTARGET_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyTARGET_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyUSES_TERMINAL_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyUSES_TERMINAL_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyUSES_TERMINAL_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyUSES_TERMINAL_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyUSES_TERMINAL_abi_cxx11_,"USES_TERMINAL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyUSES_TERMINAL_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyUSES_TERMINAL_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyVERBATIM_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyVERBATIM_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyVERBATIM_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyVERBATIM_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyVERBATIM_abi_cxx11_,"VERBATIM","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyVERBATIM_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyVERBATIM_abi_cxx11_);
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keyWORKING_DIRECTORY_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::keyWORKING_DIRECTORY_abi_cxx11_), iVar11 != 0)) {
    InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::keyWORKING_DIRECTORY_abi_cxx11_._M_dataplus._M_p =
         (pointer)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keyWORKING_DIRECTORY_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyWORKING_DIRECTORY_abi_cxx11_,"WORKING_DIRECTORY","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keyWORKING_DIRECTORY_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyWORKING_DIRECTORY_abi_cxx11_);
  }
  if (InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::keywords_abi_cxx11_ == '\0') {
    InitialPass();
  }
  if (InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::keywords_abi_cxx11_._M_h._M_element_count == 0) {
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyAPPEND_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyARGS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyBYPRODUCTS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMAND_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyCOMMENT_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyDEPENDS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyDEPFILE_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyIMPLICIT_DEPENDS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyMAIN_DEPENDENCY_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyOUTPUT_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyOUTPUTS_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPOST_BUILD_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPRE_BUILD_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyPRE_LINK_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keySOURCE_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyTARGET_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyUSES_TERMINAL_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyVERBATIM_abi_cxx11_);
    __node_gen._M_h =
         (__hashtable_alloc *)
         &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::keywords_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,
               &InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                ::keyWORKING_DIRECTORY_abi_cxx11_);
  }
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 == pbVar1) {
    bVar18 = true;
    type = POST_BUILD;
    local_328 = false;
    bVar17 = false;
    bVar4 = false;
    local_370 = (char *)0x0;
  }
  else {
    iVar11 = 0xd;
    type = POST_BUILD;
    local_370 = (char *)0x0;
    bVar7 = 0;
    bVar4 = false;
    bVar17 = false;
    local_328 = false;
    do {
      cVar12 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                       ::keywords_abi_cxx11_._M_h,pbVar21);
      if (cVar12.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_288[0]._M_allocated_capacity = local_288[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        __node_gen._M_h = (__hashtable_alloc *)local_288;
        if (iVar11 - 7U < 3) {
          bVar18 = cmsys::SystemTools::FileIsFullPath(pbVar21);
          if (!bVar18) {
            cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
            std::__cxx11::string::_M_assign((string *)&__node_gen);
            std::__cxx11::string::append((char *)&__node_gen);
          }
          std::__cxx11::string::_M_append((char *)&__node_gen,(ulong)(pbVar21->_M_dataplus)._M_p);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)&__node_gen);
        }
        bVar18 = cmsys::SystemTools::FileIsFullPath((string *)&__node_gen);
        if (bVar18) {
          cmsys::SystemTools::CollapseFullPath(&dep,(string *)&__node_gen);
          std::__cxx11::string::operator=((string *)&__node_gen,(string *)&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
        }
        switch(iVar11) {
        case 0:
          std::__cxx11::string::_M_assign((string *)&source);
          bVar18 = true;
          iVar11 = 0;
          goto LAB_00174399;
        case 1:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&currentLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,pbVar21);
          iVar11 = 1;
          break;
        case 2:
          std::__cxx11::string::_M_assign((string *)&target);
          iVar11 = 2;
          break;
        case 3:
          dep._M_dataplus._M_p = (pointer)&dep.field_2;
          pcVar2 = (pbVar21->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dep,pcVar2,pcVar2 + pbVar21->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes(&dep);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
          iVar11 = 3;
          break;
        case 4:
          std::__cxx11::string::_M_assign((string *)&implicit_depends_lang);
          iVar11 = 5;
          break;
        case 5:
          dep._M_dataplus._M_p = (pointer)&dep.field_2;
          pcVar2 = (pbVar21->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dep,pcVar2,pcVar2 + pbVar21->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes(&dep);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&dep);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::__cxx11::string&,std::__cxx11::string&>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&implicit_depends,&implicit_depends_lang,&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
          iVar11 = 4;
          break;
        case 6:
          std::__cxx11::string::_M_assign((string *)&main_dependency);
          iVar11 = 6;
          break;
        case 7:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&output,(string *)&__node_gen);
          iVar11 = 7;
          break;
        case 8:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&outputs,(string *)&__node_gen);
          iVar11 = 8;
          break;
        case 9:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&byproducts,(string *)&__node_gen);
          iVar11 = 9;
          break;
        case 10:
          std::__cxx11::string::_M_assign((string *)&comment_buffer);
          bVar18 = true;
          iVar11 = 10;
          local_370 = comment_buffer._M_dataplus._M_p;
          goto LAB_00174399;
        case 0xb:
          std::__cxx11::string::_M_assign((string *)&working);
          iVar11 = 0xb;
          break;
        case 0xc:
          std::__cxx11::string::_M_assign((string *)&depfile);
          iVar11 = 0xc;
          break;
        default:
          dep._M_dataplus._M_p = (pointer)&dep.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dep,"Wrong syntax. Unknown type of argument.","");
          cmCommand::SetError(&this->super_cmCommand,&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
          bVar18 = false;
          goto LAB_00174399;
        }
        bVar18 = true;
LAB_00174399:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__node_gen._M_h != local_288) {
          operator_delete(__node_gen._M_h,local_288[0]._M_allocated_capacity + 1);
        }
        if (!bVar18) goto LAB_001747f1;
      }
      else {
        __n = pbVar21->_M_string_length;
        if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                    ::keySOURCE_abi_cxx11_._M_string_length) &&
           ((__n == 0 ||
            (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                          InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                          ::keySOURCE_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          iVar11 = 0;
          goto LAB_00174406;
        }
        if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                    ::keyCOMMAND_abi_cxx11_._M_string_length) &&
           ((__n == 0 ||
            (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                          InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                          ::keyCOMMAND_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          iVar11 = 1;
          if ((currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                        (&commandLines.
                          super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                         &currentLine),
             pbVar5 = currentLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
             pbVar22 = currentLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish !=
             currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)) {
            paVar19 = &(currentLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar19 + -1))->_M_dataplus)._M_p;
              if (paVar19 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar3) {
                operator_delete(plVar3,paVar19->_M_allocated_capacity + 1);
              }
              pbVar20 = (pointer)(paVar19 + 1);
              paVar19 = paVar19 + 2;
            } while (pbVar20 != pbVar5);
            currentLine.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar22;
          }
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPRE_BUILD_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyPRE_BUILD_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          type = PRE_BUILD;
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPRE_LINK_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyPRE_LINK_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          type = PRE_LINK;
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyPOST_BUILD_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyPOST_BUILD_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          type = POST_BUILD;
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyVERBATIM_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyVERBATIM_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          bVar7 = 1;
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyAPPEND_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyAPPEND_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          bVar4 = true;
        }
        else if ((__n == InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keyUSES_TERMINAL_abi_cxx11_._M_string_length) &&
                ((__n == 0 ||
                 (iVar9 = bcmp((pbVar21->_M_dataplus)._M_p,
                               InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::keyUSES_TERMINAL_abi_cxx11_._M_dataplus._M_p,__n), iVar9 == 0)))) {
          bVar17 = true;
        }
        else {
          _Var6 = std::operator==(pbVar21,&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                           ::keyCOMMAND_EXPAND_LISTS_abi_cxx11_);
          if (_Var6) {
            local_328 = true;
          }
          else {
            _Var6 = std::operator==(pbVar21,&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                             ::keyTARGET_abi_cxx11_);
            if (_Var6) {
              iVar11 = 2;
            }
            else {
              _Var6 = std::operator==(pbVar21,&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                               ::keyARGS_abi_cxx11_);
              if (!_Var6) {
                _Var6 = std::operator==(pbVar21,&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                 ::keyDEPENDS_abi_cxx11_);
                if (_Var6) {
                  iVar11 = 3;
                }
                else {
                  _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyOUTPUTS_abi_cxx11_);
                  if (_Var6) {
                    iVar11 = 8;
                  }
                  else {
                    _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyOUTPUT_abi_cxx11_);
                    if (_Var6) {
                      iVar11 = 7;
                    }
                    else {
                      _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyBYPRODUCTS_abi_cxx11_);
                      if (_Var6) {
                        iVar11 = 9;
                      }
                      else {
                        _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyWORKING_DIRECTORY_abi_cxx11_);
                        if (_Var6) {
                          iVar11 = 0xb;
                        }
                        else {
                          _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyMAIN_DEPENDENCY_abi_cxx11_);
                          if (_Var6) {
                            iVar11 = 6;
                          }
                          else {
                            _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyIMPLICIT_DEPENDS_abi_cxx11_);
                            if (_Var6) {
                              iVar11 = 4;
                            }
                            else {
                              _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyCOMMENT_abi_cxx11_);
                              if (_Var6) {
                                iVar11 = 10;
                              }
                              else {
                                _Var6 = std::operator==(pbVar21,&
                                                  InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                                  ::keyDEPFILE_abi_cxx11_);
                                if (_Var6) {
                                  pcVar13 = cmMakefile::GetGlobalGenerator
                                                      ((this->super_cmCommand).Makefile);
                                  (*pcVar13->_vptr_cmGlobalGenerator[3])(&__node_gen,pcVar13);
                                  iVar9 = std::__cxx11::string::compare((char *)&__node_gen);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)__node_gen._M_h != local_288) {
                                    operator_delete(__node_gen._M_h,
                                                    local_288[0]._M_allocated_capacity + 1);
                                  }
                                  iVar11 = 0xc;
                                  if (iVar9 != 0) {
                                    pcVar13 = cmMakefile::GetGlobalGenerator
                                                        ((this->super_cmCommand).Makefile);
                                    (*pcVar13->_vptr_cmGlobalGenerator[3])(&dep,pcVar13);
                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__node_gen,"Option DEPFILE not supported by ",
                                                  &dep);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen
                                                       );
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)__node_gen._M_h != local_288) {
                                      operator_delete(__node_gen._M_h,
                                                      local_288[0]._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)dep._M_dataplus._M_p != &dep.field_2) {
                                      operator_delete(dep._M_dataplus._M_p,
                                                      dep.field_2._M_allocated_capacity + 1);
                                    }
                                    bVar17 = false;
                                    goto LAB_001747f3;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00174406:
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 != pbVar1);
    bVar18 = (bool)(bVar7 ^ 1);
  }
  if ((currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       currentLine.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &currentLine),
     pbVar1 = currentLine.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
     pbVar21 = currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     currentLine.
     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish !=
     currentLine.
     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    paVar19 = &(currentLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar3) {
        operator_delete(plVar3,paVar19->_M_allocated_capacity + 1);
      }
      pbVar22 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar22 != pbVar1);
    currentLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
  }
  if (output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && target._M_string_length == 0) {
    __node_gen._M_h = (__hashtable_alloc *)local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__node_gen,"Wrong syntax. A TARGET or OUTPUT must be specified.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
LAB_001747d4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__node_gen._M_h != local_288) {
      operator_delete(__node_gen._M_h,local_288[0]._M_allocated_capacity + 1);
    }
  }
  else {
    if (source._M_string_length == 0 && target._M_string_length != 0) {
      if (output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (bVar4) goto LAB_0017479b;
        bVar4 = false;
        goto LAB_0017495d;
      }
      __node_gen._M_h = (__hashtable_alloc *)local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__node_gen,
                 "Wrong syntax. A TARGET and OUTPUT can not both be specified.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
      goto LAB_001747d4;
    }
    if ((bool)(bVar4 & output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start ==
                       output.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)) {
LAB_0017479b:
      __node_gen._M_h = (__hashtable_alloc *)local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__node_gen,"given APPEND option with no OUTPUT.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
      goto LAB_001747d4;
    }
LAB_0017495d:
    bVar8 = CheckOutputs(this,&output);
    if (((bVar8) && (bVar8 = CheckOutputs(this,&outputs), bVar8)) &&
       (bVar8 = CheckOutputs(this,&byproducts), bVar8)) {
      if (!bVar4) {
        if ((source._M_string_length == 0) &&
           (output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __node_gen._M_h = (__hashtable_alloc *)0x0;
          local_288[0]._M_allocated_capacity = 0;
          cmMakefile::AddCustomCommandToTarget
                    ((this->super_cmCommand).Makefile,&target,&byproducts,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__node_gen,&commandLines,type,local_370,working._M_dataplus._M_p,bVar18,
                     bVar17,&depfile,local_328,RejectObjectLibraryCommands);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__node_gen);
LAB_00174f0e:
          bVar17 = true;
          goto LAB_001747f3;
        }
        if (target._M_string_length == 0) {
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&output,&byproducts,&depends,&main_dependency,
                     &commandLines,local_370,working._M_dataplus._M_p,false,bVar18,bVar17,local_328,
                     &depfile);
          bVar17 = true;
          if (implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              implicit_depends.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001747f3;
          pcVar14 = cmMakefile::GetSourceFileWithOutput
                              ((this->super_cmCommand).Makefile,
                               output.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          if ((pcVar14 != (cmSourceFile *)0x0) &&
             (pcVar15 = cmSourceFile::GetCustomCommand(pcVar14), pcVar15 != (cmCustomCommand *)0x0))
          {
            cmCustomCommand::SetImplicitDepends(pcVar15,&implicit_depends);
            goto LAB_001747f3;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&__node_gen);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&__node_gen,
                     "could not locate source file with a custom command producing \"",0x3e);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&__node_gen,
                               ((output.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                               (output.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"\" even though this command tried to create it!",0x2e);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dep._M_dataplus._M_p != &dep.field_2) {
            operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00174b30;
        }
        if (byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (!bVar17) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&__node_gen);
            t = AUTHOR_WARNING;
            PVar10 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0050,false);
            if (PVar10 - NEW < 3) {
              t = FATAL_ERROR;
              bVar17 = true;
LAB_00174e46:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&__node_gen,
                         "The SOURCE signatures of add_custom_command are no longer supported.",0x44
                        );
              this_00 = (this->super_cmCommand).Makefile;
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(this_00,t,&dep);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)dep._M_dataplus._M_p != &dep.field_2) {
                operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
              }
              if (bVar17) goto LAB_00174b30;
            }
            else if (PVar10 != OLD) {
              bVar17 = false;
              if (PVar10 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&dep,(cmPolicies *)0x32,id);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&__node_gen,dep._M_dataplus._M_p,
                                     dep._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)dep._M_dataplus._M_p != &dep.field_2) {
                  operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
                }
                bVar17 = false;
                t = AUTHOR_WARNING;
              }
              goto LAB_00174e46;
            }
            cmMakefile::AddCustomCommandOldStyle
                      ((this->super_cmCommand).Makefile,&target,&outputs,&depends,&source,
                       &commandLines,local_370);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__node_gen);
            std::ios_base::~ios_base(local_228);
            goto LAB_00174f0e;
          }
          __node_gen._M_h = (__hashtable_alloc *)local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__node_gen,"USES_TERMINAL may not be used with SOURCE signatures",""
                    );
          cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
        }
        else {
          __node_gen._M_h = (__hashtable_alloc *)local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__node_gen,"BYPRODUCTS may not be specified with SOURCE signatures",
                     "");
          cmCommand::SetError(&this->super_cmCommand,(string *)&__node_gen);
        }
        goto LAB_001747d4;
      }
      pcVar14 = cmMakefile::GetSourceFileWithOutput
                          ((this->super_cmCommand).Makefile,
                           output.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if ((pcVar14 != (cmSourceFile *)0x0) &&
         (pcVar15 = cmSourceFile::GetCustomCommand(pcVar14), pcVar15 != (cmCustomCommand *)0x0)) {
        cmCustomCommand::AppendCommands(pcVar15,&commandLines);
        cmCustomCommand::AppendDepends(pcVar15,&depends);
        bVar17 = true;
        cmCustomCommand::AppendImplicitDepends(pcVar15,&implicit_depends);
        goto LAB_001747f3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&__node_gen);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&__node_gen,"given APPEND option with output\n\"",0x21);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&__node_gen,
                           ((output.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                           (output.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"\"\nwhich is not already a custom command output.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&dep);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dep._M_dataplus._M_p != &dep.field_2) {
        operator_delete(dep._M_dataplus._M_p,dep.field_2._M_allocated_capacity + 1);
      }
LAB_00174b30:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__node_gen);
      std::ios_base::~ios_base(local_228);
    }
  }
LAB_001747f1:
  bVar17 = false;
LAB_001747f3:
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&implicit_depends.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)implicit_depends_lang._M_dataplus._M_p != &implicit_depends_lang.field_2) {
    operator_delete(implicit_depends_lang._M_dataplus._M_p,
                    CONCAT71(implicit_depends_lang.field_2._M_allocated_capacity._1_7_,
                             implicit_depends_lang.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&output);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_buffer._M_dataplus._M_p != &comment_buffer.field_2) {
    operator_delete(comment_buffer._M_dataplus._M_p,
                    CONCAT71(comment_buffer.field_2._M_allocated_capacity._1_7_,
                             comment_buffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depfile._M_dataplus._M_p != &depfile.field_2) {
    operator_delete(depfile._M_dataplus._M_p,
                    CONCAT71(depfile.field_2._M_allocated_capacity._1_7_,
                             depfile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)working._M_dataplus._M_p != &working.field_2) {
    operator_delete(working._M_dataplus._M_p,
                    CONCAT71(working.field_2._M_allocated_capacity._1_7_,
                             working.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)main_dependency._M_dataplus._M_p != &main_dependency.field_2) {
    operator_delete(main_dependency._M_dataplus._M_p,
                    CONCAT71(main_dependency.field_2._M_allocated_capacity._1_7_,
                             main_dependency.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target._M_dataplus._M_p != &target.field_2) {
    operator_delete(target._M_dataplus._M_p,
                    CONCAT71(target.field_2._M_allocated_capacity._1_7_,
                             target.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,
                    CONCAT71(source.field_2._M_allocated_capacity._1_7_,
                             source.field_2._M_local_buf[0]) + 1);
  }
  return bVar17;
}

Assistant:

bool cmAddCustomCommandCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  /* Let's complain at the end of this function about the lack of a particular
     arg. For the moment, let's say that COMMAND, and either TARGET or SOURCE
     are required.
  */
  if (args.size() < 4) {
    this->SetError("called with wrong number of arguments.");
    return false;
  }

  std::string source, target, main_dependency, working, depfile;
  std::string comment_buffer;
  const char* comment = nullptr;
  std::vector<std::string> depends, outputs, output, byproducts;
  bool verbatim = false;
  bool append = false;
  bool uses_terminal = false;
  bool command_expand_lists = false;
  std::string implicit_depends_lang;
  cmCustomCommand::ImplicitDependsList implicit_depends;

  // Accumulate one command line at a time.
  cmCustomCommandLine currentLine;

  // Save all command lines.
  cmCustomCommandLines commandLines;

  cmTarget::CustomCommandType cctype = cmTarget::POST_BUILD;

  enum tdoing
  {
    doing_source,
    doing_command,
    doing_target,
    doing_depends,
    doing_implicit_depends_lang,
    doing_implicit_depends_file,
    doing_main_dependency,
    doing_output,
    doing_outputs,
    doing_byproducts,
    doing_comment,
    doing_working_directory,
    doing_depfile,
    doing_nothing
  };

  tdoing doing = doing_nothing;

#define MAKE_STATIC_KEYWORD(KEYWORD)                                          \
  static const std::string key##KEYWORD = #KEYWORD
  MAKE_STATIC_KEYWORD(APPEND);
  MAKE_STATIC_KEYWORD(ARGS);
  MAKE_STATIC_KEYWORD(BYPRODUCTS);
  MAKE_STATIC_KEYWORD(COMMAND);
  MAKE_STATIC_KEYWORD(COMMAND_EXPAND_LISTS);
  MAKE_STATIC_KEYWORD(COMMENT);
  MAKE_STATIC_KEYWORD(DEPENDS);
  MAKE_STATIC_KEYWORD(DEPFILE);
  MAKE_STATIC_KEYWORD(IMPLICIT_DEPENDS);
  MAKE_STATIC_KEYWORD(MAIN_DEPENDENCY);
  MAKE_STATIC_KEYWORD(OUTPUT);
  MAKE_STATIC_KEYWORD(OUTPUTS);
  MAKE_STATIC_KEYWORD(POST_BUILD);
  MAKE_STATIC_KEYWORD(PRE_BUILD);
  MAKE_STATIC_KEYWORD(PRE_LINK);
  MAKE_STATIC_KEYWORD(SOURCE);
  MAKE_STATIC_KEYWORD(TARGET);
  MAKE_STATIC_KEYWORD(USES_TERMINAL);
  MAKE_STATIC_KEYWORD(VERBATIM);
  MAKE_STATIC_KEYWORD(WORKING_DIRECTORY);
#undef MAKE_STATIC_KEYWORD
  static std::unordered_set<std::string> keywords;
  if (keywords.empty()) {
    keywords.insert(keyAPPEND);
    keywords.insert(keyARGS);
    keywords.insert(keyBYPRODUCTS);
    keywords.insert(keyCOMMAND);
    keywords.insert(keyCOMMAND_EXPAND_LISTS);
    keywords.insert(keyCOMMENT);
    keywords.insert(keyDEPENDS);
    keywords.insert(keyDEPFILE);
    keywords.insert(keyIMPLICIT_DEPENDS);
    keywords.insert(keyMAIN_DEPENDENCY);
    keywords.insert(keyOUTPUT);
    keywords.insert(keyOUTPUTS);
    keywords.insert(keyPOST_BUILD);
    keywords.insert(keyPRE_BUILD);
    keywords.insert(keyPRE_LINK);
    keywords.insert(keySOURCE);
    keywords.insert(keyTARGET);
    keywords.insert(keyUSES_TERMINAL);
    keywords.insert(keyVERBATIM);
    keywords.insert(keyWORKING_DIRECTORY);
  }

  for (std::string const& copy : args) {
    if (keywords.count(copy)) {
      if (copy == keySOURCE) {
        doing = doing_source;
      } else if (copy == keyCOMMAND) {
        doing = doing_command;

        // Save the current command before starting the next command.
        if (!currentLine.empty()) {
          commandLines.push_back(currentLine);
          currentLine.clear();
        }
      } else if (copy == keyPRE_BUILD) {
        cctype = cmTarget::PRE_BUILD;
      } else if (copy == keyPRE_LINK) {
        cctype = cmTarget::PRE_LINK;
      } else if (copy == keyPOST_BUILD) {
        cctype = cmTarget::POST_BUILD;
      } else if (copy == keyVERBATIM) {
        verbatim = true;
      } else if (copy == keyAPPEND) {
        append = true;
      } else if (copy == keyUSES_TERMINAL) {
        uses_terminal = true;
      } else if (copy == keyCOMMAND_EXPAND_LISTS) {
        command_expand_lists = true;
      } else if (copy == keyTARGET) {
        doing = doing_target;
      } else if (copy == keyARGS) {
        // Ignore this old keyword.
      } else if (copy == keyDEPENDS) {
        doing = doing_depends;
      } else if (copy == keyOUTPUTS) {
        doing = doing_outputs;
      } else if (copy == keyOUTPUT) {
        doing = doing_output;
      } else if (copy == keyBYPRODUCTS) {
        doing = doing_byproducts;
      } else if (copy == keyWORKING_DIRECTORY) {
        doing = doing_working_directory;
      } else if (copy == keyMAIN_DEPENDENCY) {
        doing = doing_main_dependency;
      } else if (copy == keyIMPLICIT_DEPENDS) {
        doing = doing_implicit_depends_lang;
      } else if (copy == keyCOMMENT) {
        doing = doing_comment;
      } else if (copy == keyDEPFILE) {
        doing = doing_depfile;
        if (this->Makefile->GetGlobalGenerator()->GetName() != "Ninja") {
          this->SetError("Option DEPFILE not supported by " +
                         this->Makefile->GetGlobalGenerator()->GetName());
          return false;
        }
      }
    } else {
      std::string filename;
      switch (doing) {
        case doing_output:
        case doing_outputs:
        case doing_byproducts:
          if (!cmSystemTools::FileIsFullPath(copy)) {
            // This is an output to be generated, so it should be
            // under the build tree.  CMake 2.4 placed this under the
            // source tree.  However the only case that this change
            // will break is when someone writes
            //
            //   add_custom_command(OUTPUT out.txt ...)
            //
            // and later references "${CMAKE_CURRENT_SOURCE_DIR}/out.txt".
            // This is fairly obscure so we can wait for someone to
            // complain.
            filename = this->Makefile->GetCurrentBinaryDirectory();
            filename += "/";
          }
          filename += copy;
          cmSystemTools::ConvertToUnixSlashes(filename);
          break;
        case doing_source:
        // We do not want to convert the argument to SOURCE because
        // that option is only available for backward compatibility.
        // Old-style use of this command may use the SOURCE==TARGET
        // trick which we must preserve.  If we convert the source
        // to a full path then it will no longer equal the target.
        default:
          break;
      }

      if (cmSystemTools::FileIsFullPath(filename)) {
        filename = cmSystemTools::CollapseFullPath(filename);
      }
      switch (doing) {
        case doing_depfile:
          depfile = copy;
          break;
        case doing_working_directory:
          working = copy;
          break;
        case doing_source:
          source = copy;
          break;
        case doing_output:
          output.push_back(filename);
          break;
        case doing_main_dependency:
          main_dependency = copy;
          break;
        case doing_implicit_depends_lang:
          implicit_depends_lang = copy;
          doing = doing_implicit_depends_file;
          break;
        case doing_implicit_depends_file: {
          // An implicit dependency starting point is also an
          // explicit dependency.
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(dep);

          // Add the implicit dependency language and file.
          implicit_depends.emplace_back(implicit_depends_lang, dep);

          // Switch back to looking for a language.
          doing = doing_implicit_depends_lang;
        } break;
        case doing_command:
          currentLine.push_back(copy);
          break;
        case doing_target:
          target = copy;
          break;
        case doing_depends: {
          std::string dep = copy;
          cmSystemTools::ConvertToUnixSlashes(dep);
          depends.push_back(std::move(dep));
        } break;
        case doing_outputs:
          outputs.push_back(filename);
          break;
        case doing_byproducts:
          byproducts.push_back(filename);
          break;
        case doing_comment:
          comment_buffer = copy;
          comment = comment_buffer.c_str();
          break;
        default:
          this->SetError("Wrong syntax. Unknown type of argument.");
          return false;
      }
    }
  }

  // Store the last command line finished.
  if (!currentLine.empty()) {
    commandLines.push_back(currentLine);
    currentLine.clear();
  }

  // At this point we could complain about the lack of arguments.  For
  // the moment, let's say that COMMAND, TARGET are always required.
  if (output.empty() && target.empty()) {
    this->SetError("Wrong syntax. A TARGET or OUTPUT must be specified.");
    return false;
  }

  if (source.empty() && !target.empty() && !output.empty()) {
    this->SetError(
      "Wrong syntax. A TARGET and OUTPUT can not both be specified.");
    return false;
  }
  if (append && output.empty()) {
    this->SetError("given APPEND option with no OUTPUT.");
    return false;
  }

  // Make sure the output names and locations are safe.
  if (!this->CheckOutputs(output) || !this->CheckOutputs(outputs) ||
      !this->CheckOutputs(byproducts)) {
    return false;
  }

  // Check for an append request.
  if (append) {
    // Lookup an existing command.
    if (cmSourceFile* sf =
          this->Makefile->GetSourceFileWithOutput(output[0])) {
      if (cmCustomCommand* cc = sf->GetCustomCommand()) {
        cc->AppendCommands(commandLines);
        cc->AppendDepends(depends);
        cc->AppendImplicitDepends(implicit_depends);
        return true;
      }
    }

    // No command for this output exists.
    std::ostringstream e;
    e << "given APPEND option with output\n\"" << output[0]
      << "\"\nwhich is not already a custom command output.";
    this->SetError(e.str());
    return false;
  }

  // Choose which mode of the command to use.
  bool escapeOldStyle = !verbatim;
  if (source.empty() && output.empty()) {
    // Source is empty, use the target.
    std::vector<std::string> no_depends;
    this->Makefile->AddCustomCommandToTarget(
      target, byproducts, no_depends, commandLines, cctype, comment,
      working.c_str(), escapeOldStyle, uses_terminal, depfile,
      command_expand_lists);
  } else if (target.empty()) {
    // Target is empty, use the output.
    this->Makefile->AddCustomCommandToOutput(
      output, byproducts, depends, main_dependency, commandLines, comment,
      working.c_str(), false, escapeOldStyle, uses_terminal,
      command_expand_lists, depfile);

    // Add implicit dependency scanning requests if any were given.
    if (!implicit_depends.empty()) {
      bool okay = false;
      if (cmSourceFile* sf =
            this->Makefile->GetSourceFileWithOutput(output[0])) {
        if (cmCustomCommand* cc = sf->GetCustomCommand()) {
          okay = true;
          cc->SetImplicitDepends(implicit_depends);
        }
      }
      if (!okay) {
        std::ostringstream e;
        e << "could not locate source file with a custom command producing \""
          << output[0] << "\" even though this command tried to create it!";
        this->SetError(e.str());
        return false;
      }
    }
  } else if (!byproducts.empty()) {
    this->SetError("BYPRODUCTS may not be specified with SOURCE signatures");
    return false;
  } else if (uses_terminal) {
    this->SetError("USES_TERMINAL may not be used with SOURCE signatures");
    return false;
  } else {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0050)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0050) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The SOURCE signatures of add_custom_command are no longer "
           "supported.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }

    // Use the old-style mode for backward compatibility.
    this->Makefile->AddCustomCommandOldStyle(target, outputs, depends, source,
                                             commandLines, comment);
  }

  return true;
}